

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O0

void sqlcheck::CheckReadablePasswords
               (Configuration *state,string *sql_statement,bool *print_statement)

{
  char *pcVar1;
  allocator local_c1;
  string local_c0;
  string local_a0;
  char *local_80;
  char *message;
  PatternType pattern_type;
  allocator local_61;
  string local_60 [8];
  string title;
  regex pattern;
  bool *print_statement_local;
  string *sql_statement_local;
  Configuration *state_local;
  
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)((long)&title.field_2 + 8),
             "(password varchar)|(password text)|(password =)| (pwd varchar)|(pwd text)|(pwd =)",
             0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"Readable Passwords",&local_61);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  message._0_4_ = 4;
  local_80 = anon_var_dwarf_5acd1;
  std::__cxx11::string::string((string *)&local_a0,local_60);
  pcVar1 = local_80;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,pcVar1,&local_c1);
  CheckPattern(state,sql_statement,print_statement,(regex *)((long)&title.field_2 + 8),
               RISK_LEVEL_LOW,PATTERN_TYPE_APPLICATION,&local_a0,&local_c0,true,0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)((long)&title.field_2 + 8));
  return;
}

Assistant:

void CheckReadablePasswords(Configuration& state,
                            const std::string& sql_statement,
                            bool& print_statement){

  std::regex pattern("(password varchar)|(password text)|(password =)| "
      "(pwd varchar)|(pwd text)|(pwd =)");
  std::string title = "Readable Passwords";
  PatternType pattern_type = PatternType::PATTERN_TYPE_APPLICATION;

  auto message =
      "● Do not store readable passwords:  "
      "It’s not secure to store a password in clear text or even to pass it over the "
      "network in the clear. If an attacker can read the SQL statement you use to "
      "insert a password, they can see the password plainly. "
      "Additionally, interpolating the user's input string into the SQL query in plain text "
      "exposes it to discovery by an attacker. "
      "If you can read passwords, so can a hacker. "
      "The solution is to encode the password using a one-way cryptographic hash  "
      "function. This function transforms its input string into a new string, "
      "called the hash, that is unrecognizable. "
      "Use a salt to thwart dictionary attacks. Don't put the plain-text password "
      "into the SQL query. Instead, compute the hash in your application code, "
      "and use only the hash in the SQL query.";

  CheckPattern(state,
               sql_statement,
               print_statement,
               pattern,
               RISK_LEVEL_LOW,
               pattern_type,
               title,
               message,
               true);

}